

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::MergePartialFromCodedStream
          (MeanSquaredErrorLossLayer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  string *psVar6;
  char *field_name;
  int size;
  ulong uVar7;
  pointer data;
  
LAB_001ebf51:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ebf74;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ebf74:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_001ec011:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      if (!bVar3) {
        return false;
      }
      goto LAB_001ebf51;
    }
    uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
    if (uVar5 == 2) {
      if ((char)uVar7 == '\x12') {
        psVar6 = mutable_target_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar3) {
          return false;
        }
        psVar6 = (this->target_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.MeanSquaredErrorLossLayer.target";
        goto LAB_001ec002;
      }
      goto LAB_001ec011;
    }
    if ((uVar5 != 1) || ((char)uVar7 != '\n')) goto LAB_001ec011;
    psVar6 = mutable_input_abi_cxx11_(this);
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar3) {
      return false;
    }
    psVar6 = (this->input_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.MeanSquaredErrorLossLayer.input";
LAB_001ec002:
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name)
    ;
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool MeanSquaredErrorLossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.MeanSquaredErrorLossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string input = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->input().data(), this->input().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.MeanSquaredErrorLossLayer.input"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string target = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_target()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->target().data(), this->target().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.MeanSquaredErrorLossLayer.target"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.MeanSquaredErrorLossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.MeanSquaredErrorLossLayer)
  return false;
#undef DO_
}